

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::TestBody
          (ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  Particle<(pica::Dimension)1> a;
  Particle<(pica::Dimension)1> a_00;
  int iVar1;
  bool bVar2;
  AssertHelper local_d0;
  AssertionResult gtest_ar__1;
  ParticleArray particlesCopy;
  ParticleArray particles;
  String local_80;
  AssertHelper local_70;
  ParticleType particle;
  
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = 0xd;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              (&particle,(BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)this);
    std::
    vector<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
    ::push_back(&particles.particles,&particle);
    a.p.x = particle.p.x;
    a.position.x = particle.position.x;
    a.p.y = particle.p.y;
    a.p.z = particle.p.z;
    a.factor = particle.factor;
    a.invGamma = particle.invGamma;
    a.typeIndex = particle.typeIndex;
    a._50_6_ = particle._50_6_;
    particlesCopy.particles.
    super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ =
         BaseParticleFixture<pica::Particle<(pica::Dimension)1>>::
         eqParticles_<pica::Particle<(pica::Dimension)1>,pica::Particle<(pica::Dimension)1>>
                   ((BaseParticleFixture<pica::Particle<(pica::Dimension)1>> *)this,a,
                    particles.particles.
                    super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]);
    particlesCopy.particles.
    super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (!(bool)particlesCopy.particles.
               super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start._0_1_) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&gtest_ar__1,(AssertionResult *)&particlesCopy,
                 "this->eqParticles_(particle, particles.back())","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x67,(char *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_));
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::internal::String::~String((String *)&gtest_ar__1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_80);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&particlesCopy.particles.
                    super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
    ::vector((vector<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
              *)&particlesCopy,&particles.particles);
    a_00.p.x = particle.p.x;
    a_00.position.x = particle.position.x;
    a_00.p.y = particle.p.y;
    a_00.p.z = particle.p.z;
    a_00.factor = particle.factor;
    a_00.invGamma = particle.invGamma;
    a_00.typeIndex = particle.typeIndex;
    a_00._50_6_ = particle._50_6_;
    gtest_ar__1.success_ =
         BaseParticleFixture<pica::Particle<(pica::Dimension)1>>::
         eqParticles_<pica::Particle<(pica::Dimension)1>,pica::Particle<(pica::Dimension)1>>
                   ((BaseParticleFixture<pica::Particle<(pica::Dimension)1>> *)this,a_00,
                    particlesCopy.particles.
                    super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]);
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!gtest_ar__1.success_) {
      testing::Message::Message((Message *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_80,&gtest_ar__1,
                 "this->eqParticles_(particle, particlesCopy.back())","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x69,local_80.c_str_);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::internal::String::~String(&local_80);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_d0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__1.message_);
    std::
    _Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
    ::~_Vector_base((_Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                     *)&particlesCopy);
  }
  std::
  _Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ::~_Vector_base((_Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                   *)&particles);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}